

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O2

int ReactionJac(sunrealtype c,N_Vector y,SUNMatrix Jac,UserData udata)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  uint uVar12;
  void *returnvalue;
  ulong uVar13;
  long lVar14;
  
  lVar7 = udata->N;
  dVar3 = udata->ep;
  returnvalue = (void *)N_VGetArrayPointer();
  uVar12 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  uVar13 = (ulong)uVar12;
  if (uVar12 == 0) {
    lVar14 = 0x28;
    for (uVar13 = 1; (long)uVar13 < lVar7 + -1; uVar13 = uVar13 + 1) {
      dVar4 = *(double *)((long)returnvalue + lVar14 + -0x10);
      dVar5 = *(double *)((long)returnvalue + lVar14);
      lVar8 = *(long *)((long)Jac->content + 0x28);
      lVar9 = *(long *)((long)Jac->content + 0x40);
      lVar10 = *(long *)(lVar9 + -0x10 + lVar14);
      dVar6 = *(double *)((long)returnvalue + lVar14 + -8);
      pdVar1 = (double *)(lVar10 + lVar8 * 8);
      dVar11 = pdVar1[1];
      pdVar2 = (double *)(lVar10 + lVar8 * 8);
      *pdVar2 = *pdVar1 + -(dVar5 + 1.0) + dVar6 * (dVar4 + dVar4);
      pdVar2[1] = dVar11 + dVar5 + dVar6 * -(dVar4 + dVar4);
      *(double *)(lVar10 + 0x10 + lVar8 * 8) = *(double *)(lVar10 + 0x10 + lVar8 * 8) - dVar5;
      lVar10 = *(long *)(lVar9 + -8 + lVar14);
      *(double *)(lVar10 + -8 + lVar8 * 8) = *(double *)(lVar10 + -8 + lVar8 * 8) + dVar4 * dVar4;
      *(double *)(lVar10 + lVar8 * 8) = *(double *)(lVar10 + lVar8 * 8) - dVar4 * dVar4;
      lVar9 = *(long *)(lVar9 + lVar14);
      *(double *)(lVar9 + -0x10 + lVar8 * 8) = *(double *)(lVar9 + -0x10 + lVar8 * 8) - dVar4;
      pdVar1 = (double *)(lVar9 + -8 + lVar8 * 8);
      dVar5 = pdVar1[1];
      pdVar2 = (double *)(lVar9 + -8 + lVar8 * 8);
      *pdVar2 = dVar4 + *pdVar1;
      pdVar2[1] = (-1.0 / dVar3 - dVar4) + dVar5;
      lVar14 = lVar14 + 0x18;
    }
  }
  return (int)uVar13;
}

Assistant:

static int ReactionJac(sunrealtype c, N_Vector y, SUNMatrix Jac, UserData udata)
{
  sunindextype N = udata->N; /* set shortcuts */
  sunrealtype ep = udata->ep;
  sunindextype i;
  sunrealtype u, v, w;
  sunrealtype* Ydata = N_VGetArrayPointer(y); /* access solution array */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over nodes, filling in Jacobian of reaction terms */
  for (i = 1; i < N - 1; i++)
  {
    u = Ydata[IDX(i, 0)]; /* set nodal value shortcuts */
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* all vars wrt u */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) += c * (TWO * u * v - (w + ONE));
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 0)) += c * (w - TWO * u * v);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 0)) += c * (-w);

    /* all vars wrt v */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 1)) += c * (u * u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) += c * (-u * u);

    /* all vars wrt w */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 2)) += c * (-u);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 2)) += c * (u);
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) += c * (-ONE / ep - u);
  }

  /* Return with success */
  return 0;
}